

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader_tester.cpp
# Opt level: O2

int main(int argc,char **args)

{
  int iVar1;
  ostream *poVar2;
  char *pcVar3;
  unsigned_long uVar4;
  long *chunk_locations;
  char *__dest;
  reference this;
  size_t __n;
  int x;
  long lVar5;
  size_type __n_00;
  char *local_358;
  uint local_34c;
  size_t local_348;
  unsigned_long local_340;
  string filename;
  vector<fp_remover::classes::Wrestler,_std::allocator<fp_remover::classes::Wrestler>_> p;
  string output_name;
  string local_2e0;
  WrestlerLoader wl;
  string local_250;
  ofstream ofile;
  
  filename._M_dataplus._M_p = (pointer)&filename.field_2;
  filename._M_string_length = 0;
  output_name._M_dataplus._M_p = (pointer)&output_name.field_2;
  output_name._M_string_length = 0;
  filename.field_2._M_local_buf[0] = '\0';
  output_name.field_2._M_local_buf[0] = '\0';
  if (argc < 2) {
    std::__cxx11::string::assign((char *)&filename);
  }
  else {
    std::__cxx11::string::assign((char *)&filename);
    if (argc != 2) {
      std::__cxx11::string::assign((char *)&output_name);
      goto LAB_00104662;
    }
  }
  std::__cxx11::string::assign((char *)&output_name);
LAB_00104662:
  poVar2 = std::operator<<((ostream *)&std::cout,"loading from file ");
  poVar2 = std::operator<<(poVar2,(string *)&filename);
  std::endl<char,std::char_traits<char>>(poVar2);
  p.
  super__Vector_base<fp_remover::classes::Wrestler,_std::allocator<fp_remover::classes::Wrestler>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  p.
  super__Vector_base<fp_remover::classes::Wrestler,_std::allocator<fp_remover::classes::Wrestler>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  p.
  super__Vector_base<fp_remover::classes::Wrestler,_std::allocator<fp_remover::classes::Wrestler>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)&local_2e0,(string *)&filename);
  fp_remover::loaders::WrestlerLoader::WrestlerLoader(&wl,&local_2e0);
  std::__cxx11::string::~string((string *)&local_2e0);
  std::ofstream::ofstream(&ofile);
  iVar1 = 1;
  while( true ) {
    if (iVar1 == 10) break;
    fp_remover::loaders::WrestlerLoader::load(&wl);
    poVar2 = std::operator<<((ostream *)&std::cout,"load succesful");
    std::endl<char,std::char_traits<char>>(poVar2);
    local_34c = fp_remover::loaders::WrestlerLoader::get_record_loc(&wl);
    local_340 = fp_remover::loaders::WrestlerLoader::get_byte_skip_loc(&wl);
    fp_remover::loaders::WrestlerLoader::get_wrestlers
              ((vector<fp_remover::classes::Wrestler,_std::allocator<fp_remover::classes::Wrestler>_>
                *)&local_250,&wl);
    std::vector<fp_remover::classes::Wrestler,_std::allocator<fp_remover::classes::Wrestler>_>::
    _M_move_assign(&p,&local_250);
    std::vector<fp_remover::classes::Wrestler,_std::allocator<fp_remover::classes::Wrestler>_>::
    ~vector((vector<fp_remover::classes::Wrestler,_std::allocator<fp_remover::classes::Wrestler>_> *
            )&local_250);
    pcVar3 = fp_remover::loaders::WrestlerLoader::get_file_p(&wl);
    uVar4 = fp_remover::loaders::WrestlerLoader::get_filesize(&wl);
    chunk_locations = fp_remover::loaders::WrestlerLoader::get_chunk_locations(&wl);
    local_348 = (size_t)(int)uVar4;
    __dest = (char *)operator_new__(local_348);
    memcpy(__dest,pcVar3,local_348);
    local_358 = __dest;
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
    poVar2 = std::operator<<(poVar2," - ");
    poVar2 = std::operator<<(poVar2,"CHUNK DATA:");
    std::endl<char,std::char_traits<char>>(poVar2);
    for (lVar5 = 0; lVar5 != 0x11; lVar5 = lVar5 + 1) {
      poVar2 = (ostream *)
               std::ostream::operator<<
                         ((ostream *)&std::cout,*(int *)(__dest + chunk_locations[lVar5]));
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    for (__n_00 = 0; __n_00 != 5; __n_00 = __n_00 + 1) {
      this = std::
             vector<fp_remover::classes::Wrestler,_std::allocator<fp_remover::classes::Wrestler>_>::
             at(&p,__n_00);
      fp_remover::classes::Character::get_name_abi_cxx11_(&local_250,&this->super_Character);
      poVar2 = std::operator<<((ostream *)&std::cout,(string *)&local_250);
      std::endl<char,std::char_traits<char>>(poVar2);
      std::__cxx11::string::~string((string *)&local_250);
    }
    __n = (size_t)local_34c;
    uVar4 = remove_wrestler(&local_358,&p,0,local_34c,local_340,local_348,chunk_locations);
    pcVar3 = local_358;
    fp_remover::loaders::WrestlerLoader::write(&wl,(int)local_358,(void *)(uVar4 & 0xffffffff),__n);
    if (pcVar3 != (char *)0x0) {
      operator_delete__(pcVar3);
    }
    local_358 = (char *)0x0;
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    iVar1 = iVar1 + 1;
  }
  std::ofstream::~ofstream(&ofile);
  fp_remover::loaders::WrestlerLoader::~WrestlerLoader(&wl);
  std::vector<fp_remover::classes::Wrestler,_std::allocator<fp_remover::classes::Wrestler>_>::
  ~vector(&p);
  std::__cxx11::string::~string((string *)&output_name);
  std::__cxx11::string::~string((string *)&filename);
  return 0;
}

Assistant:

int main(int argc, char* args[])
{
	string filename;
	string output_name;
	if(argc > 1) filename = args[1];
	else filename = "savedata";
	if(argc > 2) output_name = args[2];
	else output_name = "output";

	cout << "loading from file " << filename << endl;

	vector<Wrestler> p;
	int wrestler_count_loc, size;
	unsigned long skip_byte_loc;
	const long int *chunk_locations;
	const char* fp;

	{
		WrestlerLoader wl(filename);
		char* fp_m;
		ofstream ofile;
		for(int in = 1; in < 10; in++)
		{

			wl.load();
			cout << "load succesful" << endl; // testing
			wrestler_count_loc = wl.get_record_loc();
			skip_byte_loc = wl.get_byte_skip_loc();
			p = wl.get_wrestlers();
			fp = wl.get_file_p();
			size = wl.get_filesize();
			chunk_locations = wl.get_chunk_locations();

			//cout << "removing " << p.at(in).get_name() << endl; 

			fp_m = new char[size];

			fp_m = (char*) memcpy(fp_m, fp, size);

			cout << in << " - " << "CHUNK DATA:" << endl;
			for( int x = 0; x < NUM_CHUNKS; x++)
			{
				cout << *(int*) &fp_m[chunk_locations[x]] << endl;
			}
			
			//for(auto& x : p) cout << x.get_name() << endl;
			for( int x = 0; x < 5; x++) cout << p.at(x).get_name() << endl;
			// remove wrestler at in input from the user
			size = remove_wrestler(fp_m, p, 0, wrestler_count_loc, skip_byte_loc, size, chunk_locations);

			wl.write(fp_m, size);

			//ofile.open(output_name, ios_base::binary | ios_base::trunc);
			//ofile.write(fp_m, size);
			//ofile.close();
			fp = nullptr;
			delete [] fp_m;
			fp_m = nullptr;
			chunk_locations = nullptr;
			//p.clear();
			cout << endl;
		}

	} // destroy uneeded loader
	return 0;
}